

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O2

void __thiscall
ktx::SelectorRange::SelectorRange(SelectorRange *this,RangeIndex begin,RangeIndex end)

{
  HalfRange local_18;
  
  (this->ranges).
  super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ranges).
  super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ranges).
  super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18.end = end;
  local_18.begin = begin;
  std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
  emplace_back<ktx::SelectorRange::HalfRange>(&this->ranges,&local_18);
  return;
}

Assistant:

SelectorRange(RangeIndex begin, RangeIndex end) {
        ranges.emplace_back(HalfRange{begin, end});
    }